

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toml.h
# Opt level: O1

Value __thiscall toml::internal::Parser::parse(Parser *this)

{
  size_type *psVar1;
  _Base_ptr p_Var2;
  TokenType TVar3;
  Value *pVVar4;
  bool bVar5;
  Value *current;
  size_t *psVar6;
  anon_union_8_8_51f126cb_for_Value_2 extraout_RDX;
  Parser *in_RSI;
  Value VVar7;
  Value local_68;
  undefined1 local_58 [32];
  _Base_ptr local_38;
  size_t sStack_30;
  
  current = &local_68;
  p_Var2 = (_Base_ptr)(local_58 + 8);
  local_58._16_8_ = (_Base_ptr)0x0;
  local_58._0_8_ = (pointer)0x0;
  local_58._8_8_ = 0;
  sStack_30 = 0;
  local_68.type_ = TABLE_TYPE;
  local_58._24_8_ = p_Var2;
  local_38 = p_Var2;
  local_68.field_1.null_ = operator_new(0x30);
  psVar1 = &(local_68.field_1.string_)->_M_string_length;
  *(undefined4 *)&(local_68.field_1.string_)->_M_string_length = 0;
  if ((_Base_ptr)local_58._16_8_ == (_Base_ptr)0x0) {
    ((local_68.field_1.array_)->super__Vector_base<toml::Value,_std::allocator<toml::Value>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    *(size_type **)((long)&(local_68.field_1.string_)->field_2 + 8) = psVar1;
    ((local_68.field_1.table_)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
         (_Base_ptr)psVar1;
    psVar6 = &((local_68.field_1.table_)->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
  }
  else {
    ((local_68.field_1.array_)->super__Vector_base<toml::Value,_std::allocator<toml::Value>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_58._16_8_;
    psVar6 = &sStack_30;
    *(undefined8 *)((long)&(local_68.field_1.string_)->field_2 + 8) = local_58._24_8_;
    ((local_68.field_1.table_)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = local_38;
    ((anon_union_8_8_51f126cb_for_Value_2 *)(local_58._16_8_ + 8))->null_ = psVar1;
    ((local_68.field_1.table_)->_M_t)._M_impl.super__Rb_tree_header._M_node_count = sStack_30;
    local_58._16_8_ = (_Base_ptr)0x0;
    local_58._24_8_ = p_Var2;
    local_38 = p_Var2;
  }
  pVVar4 = &local_68;
  *psVar6 = 0;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
               *)local_58);
  while( true ) {
    while ((in_RSI->token_).type_ == END_OF_LINE) {
      nextKey(in_RSI);
    }
    TVar3 = (in_RSI->token_).type_;
    if (TVar3 == END_OF_FILE) break;
    if (TVar3 == LBRACKET) {
      current = parseGroupKey(in_RSI,&local_68);
      if (current == (Value *)0x0) {
        local_58._0_8_ = local_58 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_58,"error when parsing group key","");
        addError(in_RSI,(string *)local_58);
LAB_00158c5b:
        if ((undefined1 *)local_58._0_8_ != local_58 + 0x10) {
          operator_delete((void *)local_58._0_8_,(ulong)(local_58._16_8_ + 1));
        }
        *(undefined4 *)&(this->lexer_).is_ = 0;
        pVVar4 = (Value *)&this->lexer_;
LAB_00158c7f:
        (pVVar4->field_1).null_ = (void *)0x0;
        Value::~Value(&local_68);
        VVar7.field_1.null_ = extraout_RDX.null_;
        VVar7._0_8_ = this;
        return VVar7;
      }
    }
    else {
      bVar5 = parseKeyValue(in_RSI,current);
      if (!bVar5) {
        local_58._0_8_ = local_58 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_58,"error when parsing key Value","");
        addError(in_RSI,(string *)local_58);
        goto LAB_00158c5b;
      }
    }
  }
  *(Type *)&(this->lexer_).is_ = local_68.type_;
  switch(local_68.type_) {
  case NULL_TYPE:
  case INT_TYPE:
  case STRING_TYPE:
  case TIME_TYPE:
  case ARRAY_TYPE:
  case TABLE_TYPE:
    *(anon_union_8_8_51f126cb_for_Value_2 *)&(this->lexer_).lineNo_ = (Table *)local_68.field_1;
    break;
  case BOOL_TYPE:
    *(bool *)&(this->lexer_).lineNo_ = local_68.field_1.bool_;
    break;
  case DOUBLE_TYPE:
    *(anon_union_8_8_51f126cb_for_Value_2 *)&(this->lexer_).lineNo_ = (Table *)local_68.field_1;
    break;
  default:
    *(undefined4 *)&(this->lexer_).is_ = 0;
    *(undefined8 *)&(this->lexer_).lineNo_ = 0;
  }
  local_68.type_ = NULL_TYPE;
  goto LAB_00158c7f;
}

Assistant:

inline Value Parser::parse()
{
    Value root((Table()));
    Value* currentValue = &root;

    while (true) {
        skipForKey();
        if (token().type() == TokenType::END_OF_FILE)
            break;
        if (token().type() == TokenType::LBRACKET) {
            currentValue = parseGroupKey(&root);
            if (!currentValue) {
                addError("error when parsing group key");
                return Value();
            }
            continue;
        }

        if (!parseKeyValue(currentValue)) {
            addError("error when parsing key Value");
            return Value();
        }
    }
    return root;
}